

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_scandir_file(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test/fixtures/empty_file",0,(uv_fs_cb)0x0);
  if (iVar1 == -0x14) {
    uv_fs_req_cleanup(&scandir_req);
    iVar1 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar1 == 0) {
      if (scandir_cb_count == 0) {
        uv_run(loop,UV_RUN_DEFAULT);
        if (scandir_cb_count == 1) {
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
          uVar3 = 0xa93;
        }
        else {
          pcVar4 = "scandir_cb_count == 1";
          uVar3 = 0xa91;
        }
      }
      else {
        pcVar4 = "scandir_cb_count == 0";
        uVar3 = 0xa8f;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0xa8d;
    }
  }
  else {
    pcVar4 = "r == UV_ENOTDIR";
    uVar3 = 0xa89;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_scandir_file) {
  const char* path;
  int r;

  path = "test/fixtures/empty_file";
  loop = uv_default_loop();

  r = uv_fs_scandir(NULL, &scandir_req, path, 0, NULL);
  ASSERT(r == UV_ENOTDIR);
  uv_fs_req_cleanup(&scandir_req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, file_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}